

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

DdNode * cuddHashTableLookup3(DdHashTable *hash,DdNode *f,DdNode *g,DdNode *h)

{
  ptrint *ppVar1;
  int *piVar2;
  DdHashItem **ppDVar3;
  DdNode *pDVar4;
  DdHashItem **ppDVar5;
  uint uVar6;
  DdHashItem *pDVar7;
  DdHashItem *pDVar8;
  DdHashItem *pDVar9;
  
  uVar6 = (((uint)h & 1) + *(int *)(((ulong)h & 0xfffffffffffffffe) + 0x20) * 2 +
          (((uint)f & 1) + *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2 +
          ((uint)g & 1) + *(int *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
          0x40f1f9 >> ((byte)hash->shift & 0x1f);
  ppDVar3 = hash->bucket;
  pDVar9 = ppDVar3[uVar6];
  if (pDVar9 == (DdHashItem *)0x0) {
    return (DdNode *)0x0;
  }
  pDVar8 = (DdHashItem *)0x0;
  while (((pDVar9->key[0] != f || ((DdNode *)pDVar9[1].next != g)) ||
         ((DdNode *)pDVar9[1].count != h))) {
    ppDVar5 = &pDVar9->next;
    pDVar8 = pDVar9;
    pDVar9 = *ppDVar5;
    if (*ppDVar5 == (DdHashItem *)0x0) {
      return (DdNode *)0x0;
    }
  }
  pDVar4 = pDVar9->value;
  ppVar1 = &pDVar9->count;
  *ppVar1 = *ppVar1 + -1;
  if (*ppVar1 != 0) {
    return pDVar4;
  }
  piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
  *piVar2 = *piVar2 + -1;
  pDVar7 = (DdHashItem *)(ppDVar3 + uVar6);
  if (pDVar8 != (DdHashItem *)0x0) {
    pDVar7 = pDVar8;
  }
  pDVar7->next = pDVar9->next;
  pDVar9->next = hash->nextFree;
  hash->nextFree = pDVar9;
  hash->size = hash->size - 1;
  return pDVar4;
}

Assistant:

DdNode *
cuddHashTableLookup3(
  DdHashTable * hash,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    unsigned int posn;
    DdHashItem *item, *prev;

#ifdef DD_DEBUG
    assert(hash->keysize == 3);
#endif

    posn = ddLCHash3(cuddF2L(f),cuddF2L(g),cuddF2L(h),hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    while (item != NULL) {
        DdNodePtr *key = item->key;
        if ((f == key[0]) && (g == key[1]) && (h == key[2])) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}